

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseExpression(Parser *this)

{
  int in_ESI;
  Parser *this_local;
  
  this_local = this;
  parseUnaryExpression((Parser *)&stack0xffffffffffffffe0);
  parseBinaryOpRHS(this,in_ESI,(unique_ptr<Expression,_std::default_delete<Expression>_> *)0x0);
  std::unique_ptr<Expression,_std::default_delete<Expression>_>::~unique_ptr
            ((unique_ptr<Expression,_std::default_delete<Expression>_> *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseExpression() {
	return parseBinaryOpRHS(0, parseUnaryExpression());
}